

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagUndefinedArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,uint8_t *value
              )

{
  int iVar1;
  
  if (dir != (TIFFDirEntry *)0x0) {
    iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,7,count,count,value);
    return iVar1;
  }
  *ndir = *ndir + 1;
  return 1;
}

Assistant:

static int TIFFWriteDirectoryTagUndefinedArray(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint32_t count, uint8_t *value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedUndefinedArray(tif, ndir, dir, tag,
                                                       count, value));
}